

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *p_v,void *p_min,void *p_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 uVar1;
  undefined2 uVar2;
  bool bVar3;
  undefined2 *in_RCX;
  undefined4 in_EDX;
  double *in_R8;
  double *in_R9;
  uint in_stack_00000010;
  bool r_3;
  ImU32 v32_3;
  uint in_stack_00000038;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  uint *in_stack_00000040;
  ImU32 v32_1;
  float in_stack_00000048;
  bool r;
  ImS32 v32;
  ImGuiContext *g;
  ImRect *in_stack_00000080;
  ImGuiDataType in_stack_00000088;
  ImGuiID in_stack_0000008c;
  bool local_1;
  
  if ((in_stack_00000010 == 1) || (bVar3 = false, (in_stack_00000010 & 0x7000000f) == 0)) {
    bVar3 = true;
  }
  if (!bVar3) {
    __assert_fail("(flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && \"Invalid ImGuiSliderFlags flag!  Has the \'float power\' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0xb24,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                 );
  }
  if ((((GImGui->CurrentWindow->DC).ItemFlags & 0x80U) == 0) &&
     ((in_stack_00000010 & 0x200000) == 0)) {
    switch(in_EDX) {
    case 0:
      uVar1 = *(undefined1 *)in_RCX;
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,(int *)in_stack_00000040
                           ,v32_2,in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      if (local_1) {
        *(undefined1 *)in_RCX = uVar1;
      }
      break;
    case 1:
      uVar1 = *(undefined1 *)in_RCX;
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,in_stack_00000040,v32_2,
                           in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      if (local_1) {
        *(undefined1 *)in_RCX = uVar1;
      }
      break;
    case 2:
      uVar2 = *in_RCX;
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,(int *)in_stack_00000040
                           ,v32_2,in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      if (local_1) {
        *in_RCX = uVar2;
      }
      break;
    case 3:
      uVar2 = *in_RCX;
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,in_stack_00000040,v32_2,
                           in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      if (local_1) {
        *in_RCX = uVar2;
      }
      break;
    case 4:
      bVar3 = false;
      if (-0x40000001 < (int)*(float *)in_R8) {
        bVar3 = (int)*(float *)in_R9 < 0x40000000;
      }
      if (!bVar3) {
        __assert_fail("*(const ImS32*)p_min >= IM_S32_MIN / 2 && *(const ImS32*)p_max <= IM_S32_MAX / 2"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb31,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,(int *)in_stack_00000040
                           ,v32_2,in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      break;
    case 5:
      if (0x7fffffff < (uint)*(float *)in_R9) {
        __assert_fail("*(const ImU32*)p_max <= IM_U32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb34,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<unsigned_int,int,float>
                          ((ImRect *)g,v32,(ImGuiDataType)in_stack_00000048,in_stack_00000040,v32_2,
                           in_stack_00000038,(char *)p_min,(ImGuiSliderFlags)p_v,
                           (ImRect *)CONCAT44(id,data_type));
      break;
    case 6:
      bVar3 = false;
      if (-0x4000000000000001 < (long)*in_R8) {
        bVar3 = (long)*in_R9 < 0x4000000000000000;
      }
      if (!bVar3) {
        __assert_fail("*(const ImS64*)p_min >= IM_S64_MIN / 2 && *(const ImS64*)p_max <= IM_S64_MAX / 2"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb37,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<long_long,long_long,double>
                          (in_stack_00000080,bb._4_4_,(ImGuiDataType)bb,
                           (longlong *)CONCAT44(id,data_type),(longlong)p_v,(longlong)p_min,format,
                           flags,out_grab_bb);
      break;
    case 7:
      if (0x7fffffffffffffff < (ulong)*in_R9) {
        __assert_fail("*(const ImU64*)p_max <= IM_U64_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb3a,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                          (in_stack_00000080,bb._4_4_,(ImGuiDataType)bb,
                           (unsigned_long_long *)CONCAT44(id,data_type),(unsigned_long_long)p_v,
                           (unsigned_long_long)p_min,format,flags,out_grab_bb);
      break;
    case 8:
      bVar3 = false;
      if (-1.7014117e+38 <= *(float *)in_R8) {
        bVar3 = *(float *)in_R9 <= 1.7014117e+38;
      }
      if (!bVar3) {
        __assert_fail("*(const float*)p_min >= -3.40282347e+38F / 2.0f && *(const float*)p_max <= 3.40282347e+38F / 2.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb3d,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<float,float,float>
                          ((ImRect *)p_min,p_max._4_4_,(ImGuiDataType)p_max,(float *)g,(float)v32,
                           in_stack_00000048,(char *)in_stack_00000040,v32_2,
                           (ImRect *)CONCAT44(id,data_type));
      break;
    case 9:
      bVar3 = false;
      if (-8.988465674311579e+307 <= *in_R8) {
        bVar3 = *in_R9 <= 8.988465674311579e+307;
      }
      if (!bVar3) {
        __assert_fail("*(const double*)p_min >= -1.7976931348623157e+308 / 2.0f && *(const double*)p_max <= 1.7976931348623157e+308 / 2.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                      ,0xb40,
                      "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                     );
      }
      local_1 = SliderBehaviorT<double,double,double>
                          ((ImRect *)format,in_stack_0000008c,in_stack_00000088,
                           (double *)in_stack_00000080,(double)bb,(double)CONCAT44(id,data_type),
                           (char *)p_v,p_min._4_4_,out_grab_bb);
      break;
    case 10:
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0xb44,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiSliderFlags, ImRect *)"
                   );
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* p_v, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flag!  Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if ((g.CurrentWindow->DC.ItemFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)p_min,  *(const ImS8*)p_max,  format, flags, out_grab_bb); if (r) *(ImS8*)p_v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)p_min,  *(const ImU8*)p_max,  format, flags, out_grab_bb); if (r) *(ImU8*)p_v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)p_min, *(const ImS16*)p_max, format, flags, out_grab_bb); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)p_min, *(const ImU16*)p_max, format, flags, out_grab_bb); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)p_min >= IM_S32_MIN / 2 && *(const ImS32*)p_max <= IM_S32_MAX / 2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)p_v,  *(const ImS32*)p_min,  *(const ImS32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)p_max <= IM_U32_MAX / 2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)p_v,  *(const ImU32*)p_min,  *(const ImU32*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)p_min >= IM_S64_MIN / 2 && *(const ImS64*)p_max <= IM_S64_MAX / 2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)p_v,  *(const ImS64*)p_min,  *(const ImS64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)p_max <= IM_U64_MAX / 2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)p_v,  *(const ImU64*)p_min,  *(const ImU64*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)p_min >= -FLT_MAX / 2.0f && *(const float*)p_max <= FLT_MAX / 2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)p_v,  *(const float*)p_min,  *(const float*)p_max,  format, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)p_min >= -DBL_MAX / 2.0f && *(const double*)p_max <= DBL_MAX / 2.0f);
        return SliderBehaviorT<double, double, double>(bb, id, data_type, (double*)p_v, *(const double*)p_min, *(const double*)p_max, format, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}